

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O3

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getStrictSubTypes(SubTypes *this,HeapType type)

{
  const_iterator cVar1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_20;
  key_type local_18;
  HeapType type_local;
  
  local_18.id = type.id;
  if (0xd < type.id) {
    cVar1 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->typeSubTypes)._M_h,&local_18);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      if (getStrictSubTypes(wasm::HeapType)::empty == '\0') {
        getStrictSubTypes();
      }
      else {
        local_20 = &getStrictSubTypes::empty;
      }
    }
    else {
      local_20 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 ((long)cVar1.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur + 0x10);
    }
    return local_20;
  }
  __assert_fail("!type.isBasic()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/subtypes.h"
                ,0x28,
                "const std::vector<HeapType> &wasm::SubTypes::getStrictSubTypes(HeapType) const");
}

Assistant:

const std::vector<HeapType>& getStrictSubTypes(HeapType type) const {
    assert(!type.isBasic());
    if (auto iter = typeSubTypes.find(type); iter != typeSubTypes.end()) {
      return iter->second;
    }

    // No entry exists. Return a canonical constant empty vec, to avoid
    // allocation.
    static const std::vector<HeapType> empty;
    return empty;
  }